

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O3

int read_att_array(coda_netcdf_product *product,int64_t *offset,coda_mem_record **attributes,
                  coda_conversion *conversion)

{
  size_t __size;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  byte bVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [15];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [15];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  coda_mem_record **ppcVar49;
  long length;
  ushort uVar50;
  int iVar51;
  int iVar52;
  coda_type_record *definition;
  coda_mem_record *pcVar53;
  coda_netcdf_basic_type *base_type;
  coda_netcdf_basic_type *field_type;
  long lVar54;
  char *pcVar55;
  ulong uVar56;
  uint nc_type;
  float fVar57;
  double dVar58;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 uVar71;
  undefined1 uVar75;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int64_t num_att;
  long dim [8];
  int64_t nelems;
  int64_t string_length;
  uint local_c0;
  int local_bc;
  coda_mem_record **local_b8;
  ulong local_b0;
  long local_a8;
  double local_a0;
  double local_98;
  long local_90;
  double local_88 [8];
  long local_48;
  double local_40;
  long local_38;
  undefined1 auVar61 [16];
  
  iVar51 = read_bytes(product->raw_product,*offset,4,&local_bc);
  if (-1 < iVar51) {
    auVar59 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_bc >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_bc >> 0x10),local_bc))
                                                  >> 0x20),local_bc) >> 0x18),
                                        (char)((uint)local_bc >> 8)),(ushort)(byte)local_bc) &
                      0xffffff00ffffff);
    auVar59 = pshuflw(auVar59,auVar59,0x1b);
    sVar1 = auVar59._0_2_;
    sVar2 = auVar59._2_2_;
    sVar3 = auVar59._4_2_;
    sVar4 = auVar59._6_2_;
    local_bc = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4),
                        CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar59[4] - (0xff < sVar3),
                                 CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar59[2] -
                                          (0xff < sVar2),
                                          (0 < sVar1) * (sVar1 < 0x100) * auVar59[0] -
                                          (0xff < sVar1))));
    *offset = *offset + 4;
    iVar51 = read_length_value(product,offset,&local_90);
    if (iVar51 == 0) {
      if (local_bc == 0xc) {
        definition = coda_type_record_new(coda_format_netcdf);
        if (definition != (coda_type_record *)0x0) {
          pcVar53 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
          *attributes = pcVar53;
          coda_type_release((coda_type *)definition);
          if (*attributes != (coda_mem_record *)0x0) {
            local_48 = local_90;
            if (local_90 < 1) {
              return 0;
            }
            lVar54 = 0;
            local_b8 = attributes;
            do {
              ppcVar49 = local_b8;
              iVar51 = read_length_value(product,offset,&local_38);
              length = local_38;
              if (iVar51 != 0) {
LAB_00169a9c:
                pcVar53 = *ppcVar49;
                goto LAB_00169a9f;
              }
              __size = local_38 + 1;
              local_a8 = lVar54;
              pcVar55 = (char *)malloc(__size);
              if (pcVar55 == (char *)0x0) {
                coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                               ,0xf1);
                goto LAB_00169a9c;
              }
              pcVar55[length] = '\0';
              iVar51 = read_bytes(product->raw_product,*offset,length,pcVar55);
              if (iVar51 < 0) {
LAB_00169a93:
                free(pcVar55);
                goto LAB_00169a9c;
              }
              uVar56 = (ulong)((uint)length & 3);
              lVar54 = ((*offset + length) - uVar56) + 4;
              if (uVar56 == 0) {
                lVar54 = *offset + length;
              }
              *offset = lVar54;
              iVar51 = read_bytes(product->raw_product,lVar54,4,&local_c0);
              if (iVar51 < 0) goto LAB_00169a93;
              auVar16._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
              auVar16[0] = (char)(local_c0 >> 0x18);
              auVar16._10_6_ = 0;
              auVar61._5_11_ = SUB1611(auVar16 << 0x30,5);
              auVar61[4] = (char)(local_c0 >> 0x10);
              auVar61._0_4_ = local_c0;
              auVar59._12_4_ = 0;
              auVar59._0_12_ = auVar61._4_12_;
              auVar60._3_13_ = SUB1613(auVar59 << 0x20,3);
              auVar60[2] = (char)(local_c0 >> 8);
              auVar60[0] = (byte)local_c0;
              auVar60[1] = 0;
              auVar59 = pshuflw(auVar60,auVar60,0x1b);
              sVar1 = auVar59._0_2_;
              sVar2 = auVar59._2_2_;
              sVar3 = auVar59._4_2_;
              sVar4 = auVar59._6_2_;
              local_c0 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4),
                                  CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar59[4] -
                                           (0xff < sVar3),
                                           CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar59[2] -
                                                    (0xff < sVar2),
                                                    (0 < sVar1) * (sVar1 < 0x100) * auVar59[0] -
                                                    (0xff < sVar1))));
              *offset = *offset + 4;
              iVar51 = read_length_value(product,offset,(int64_t *)&local_40);
              if (iVar51 != 0) goto LAB_00169a93;
              iVar51 = local_c0 - 1;
              dVar58 = local_40;
              switch(iVar51) {
              case 0:
              case 1:
                break;
              case 2:
                dVar58 = (double)((long)local_40 * 2);
                break;
              case 3:
              case 4:
                dVar58 = (double)((long)local_40 * 4);
                break;
              case 5:
                dVar58 = (double)((long)local_40 * 8);
                break;
              default:
                coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))",(ulong)local_c0
                              );
                goto LAB_00169a93;
              }
              local_98 = local_40;
              nc_type = local_c0;
              local_a0 = dVar58;
              if (local_40 != 4.94065645841247e-324 || conversion == (coda_conversion *)0x0)
              goto LAB_001698e6;
              local_b0 = (ulong)local_c0;
              iVar52 = strcmp(pcVar55,"scale_factor");
              if ((iVar52 != 0) && (iVar52 = strcmp(pcVar55,"add_offset"), iVar52 != 0)) {
                nc_type = (uint)local_b0;
                if (nc_type != 2) goto LAB_001697dd;
                goto LAB_001698ec;
              }
              nc_type = (uint)local_b0;
              if (nc_type == 2) goto LAB_001698ec;
              if (nc_type == 6) {
                iVar52 = read_bytes(product->raw_product,*offset,8,local_88);
                if (iVar52 < 0) goto LAB_00169a93;
                auVar12._8_6_ = 0;
                auVar12._0_8_ = local_88[0];
                auVar12[0xe] = (char)((ulong)local_88[0] >> 0x38);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = local_88[0];
                auVar22[0xc] = (char)((ulong)local_88[0] >> 0x30);
                auVar22._13_2_ = auVar12._13_2_;
                auVar33._8_4_ = 0;
                auVar33._0_8_ = local_88[0];
                auVar33._12_3_ = auVar22._12_3_;
                auVar37._8_2_ = 0;
                auVar37._0_8_ = local_88[0];
                auVar37[10] = (char)((ulong)local_88[0] >> 0x28);
                auVar37._11_4_ = auVar33._11_4_;
                auVar41._8_2_ = 0;
                auVar41._0_8_ = local_88[0];
                auVar41._10_5_ = auVar37._10_5_;
                auVar45[8] = (char)((ulong)local_88[0] >> 0x20);
                auVar45._0_8_ = local_88[0];
                auVar45._9_6_ = auVar41._9_6_;
                uVar56 = CONCAT17(0,auVar45._8_7_);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = uVar56;
                auVar20._1_9_ = SUB169(auVar21 << 0x40,7);
                auVar20[0] = (char)((ulong)local_88[0] >> 0x18);
                auVar20._10_6_ = 0;
                auVar9._1_11_ = SUB1611(auVar20 << 0x30,5);
                auVar9[0] = (char)((ulong)local_88[0] >> 0x10);
                auVar19._12_4_ = 0;
                auVar19._0_12_ = auVar9;
                auVar63._3_13_ = SUB1613(auVar19 << 0x20,3);
                auVar63[2] = (char)((ulong)local_88[0] >> 8);
                auVar63[0] = SUB81(local_88[0],0);
                auVar63[1] = 0;
                auVar64._8_4_ = auVar63._0_4_;
                auVar64._0_8_ = uVar56;
                auVar64._12_4_ = auVar9._0_4_;
                auVar59 = pshuflw(auVar64,auVar64,0x1b);
                auVar59 = pshufhw(auVar59,auVar59,0x1b);
                sVar1 = auVar59._0_2_;
                sVar2 = auVar59._2_2_;
                sVar3 = auVar59._4_2_;
                sVar4 = auVar59._6_2_;
                sVar5 = auVar59._8_2_;
                sVar6 = auVar59._10_2_;
                sVar7 = auVar59._12_2_;
                sVar8 = auVar59._14_2_;
                local_88[0] = (double)CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar59[0xe] -
                                               (0xff < sVar8),
                                               CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar59[0xc]
                                                        - (0xff < sVar7),
                                                        CONCAT15((0 < sVar6) * (sVar6 < 0x100) *
                                                                 auVar59[10] - (0xff < sVar6),
                                                                 CONCAT14((0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar59[8] -
                                                                          (0xff < sVar5),
                                                                          CONCAT13((0 < sVar4) *
                                                                                   (sVar4 < 0x100) *
                                                                                   auVar59[6] -
                                                                                   (0xff < sVar4),
                                                                                   CONCAT12((0 < 
                                                  sVar3) * (sVar3 < 0x100) * auVar59[4] -
                                                  (0xff < sVar3),
                                                  CONCAT11((0 < sVar2) * (sVar2 < 0x100) *
                                                           auVar59[2] - (0xff < sVar2),
                                                           (0 < sVar1) * (sVar1 < 0x100) *
                                                           auVar59[0] - (0xff < sVar1))))))));
                (&conversion->numerator)[(ulong)(*pcVar55 != 's') * 2] = local_88[0];
              }
              else if (nc_type == 5) {
                iVar52 = read_bytes(product->raw_product,*offset,4,local_88);
                if (iVar52 < 0) goto LAB_00169a93;
                auVar18._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
                auVar18[0] = (char)((ulong)local_88[0] >> 0x18);
                auVar18._10_6_ = 0;
                auVar17._1_11_ = SUB1611(auVar18 << 0x30,5);
                auVar17[0] = (char)((ulong)local_88[0] >> 0x10);
                auVar17._12_4_ = 0;
                auVar62._3_13_ = SUB1613(auVar17 << 0x20,3);
                auVar62[2] = (char)((ulong)local_88[0] >> 8);
                auVar62[0] = SUB81(local_88[0],0);
                auVar62[1] = 0;
                auVar59 = pshuflw(auVar62,auVar62,0x1b);
                sVar1 = auVar59._0_2_;
                sVar2 = auVar59._2_2_;
                sVar3 = auVar59._4_2_;
                sVar4 = auVar59._6_2_;
                fVar57 = (float)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4)
                                         ,CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar59[4] -
                                                   (0xff < sVar3),
                                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) *
                                                            auVar59[2] - (0xff < sVar2),
                                                            (0 < sVar1) * (sVar1 < 0x100) *
                                                            auVar59[0] - (0xff < sVar1))));
                local_88[0] = (double)CONCAT44(local_88[0]._4_4_,fVar57);
                (&conversion->numerator)[(ulong)(*pcVar55 != 's') * 2] = (double)fVar57;
              }
LAB_001697dd:
              iVar52 = strcmp(pcVar55,"missing_value");
              if ((iVar52 != 0) &&
                 ((iVar52 = strcmp(pcVar55,"_FillValue"), iVar52 != 0 ||
                  (iVar52 = coda_isNaN(conversion->invalid_value), iVar52 == 0))))
              goto LAB_001698e6;
              iVar52 = read_bytes(product->raw_product,*offset,(int64_t)local_a0,local_88);
              if (iVar52 < 0) goto LAB_00169a93;
              uVar69 = (undefined1)((ulong)local_88[0] >> 8);
              uVar70 = (undefined1)((ulong)local_88[0] >> 0x10);
              uVar71 = (undefined1)((ulong)local_88[0] >> 0x18);
              uVar72 = (undefined1)((ulong)local_88[0] >> 0x20);
              uVar73 = (undefined1)((ulong)local_88[0] >> 0x28);
              uVar74 = (undefined1)((ulong)local_88[0] >> 0x30);
              uVar75 = (undefined1)((ulong)local_88[0] >> 0x38);
              switch(iVar51) {
              case 0:
                iVar51 = (int)(char)local_88[0]._0_1_;
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                              ,0x1af,
                              "int read_att_array(coda_netcdf_product *, int64_t *, coda_mem_record **, coda_conversion *)"
                             );
              case 2:
                uVar50 = local_88[0]._0_2_ << 8 | local_88[0]._0_2_ >> 8;
                local_88[0] = (double)CONCAT62(local_88[0]._2_6_,uVar50);
                iVar51 = (int)(short)uVar50;
                break;
              case 3:
                auVar14._8_6_ = 0;
                auVar14._0_8_ = local_88[0];
                auVar14[0xe] = uVar75;
                auVar29._8_4_ = 0;
                auVar29._0_8_ = local_88[0];
                auVar29[0xc] = uVar74;
                auVar29._13_2_ = auVar14._13_2_;
                auVar35._8_4_ = 0;
                auVar35._0_8_ = local_88[0];
                auVar35._12_3_ = auVar29._12_3_;
                auVar39._8_2_ = 0;
                auVar39._0_8_ = local_88[0];
                auVar39[10] = uVar73;
                auVar39._11_4_ = auVar35._11_4_;
                auVar43._8_2_ = 0;
                auVar43._0_8_ = local_88[0];
                auVar43._10_5_ = auVar39._10_5_;
                auVar47[8] = uVar72;
                auVar47._0_8_ = local_88[0];
                auVar47._9_6_ = auVar43._9_6_;
                auVar28._1_9_ = SUB169(ZEXT716(auVar47._8_7_) << 0x40,7);
                auVar28[0] = uVar71;
                auVar28._10_6_ = 0;
                auVar27._1_11_ = SUB1611(auVar28 << 0x30,5);
                auVar27[0] = uVar70;
                auVar27._12_4_ = 0;
                auVar67._3_13_ = SUB1613(auVar27 << 0x20,3);
                auVar67[2] = uVar69;
                auVar67[1] = 0;
                auVar67[0] = local_88[0]._0_1_;
                auVar59 = pshuflw(auVar67,auVar67,0x1b);
                sVar1 = auVar59._0_2_;
                sVar2 = auVar59._2_2_;
                sVar3 = auVar59._4_2_;
                sVar4 = auVar59._6_2_;
                iVar51 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4),
                                  CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar59[4] -
                                           (0xff < sVar3),
                                           CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar59[2] -
                                                    (0xff < sVar2),
                                                    (0 < sVar1) * (sVar1 < 0x100) * auVar59[0] -
                                                    (0xff < sVar1))));
                local_88[0] = (double)CONCAT44(local_88[0]._4_4_,iVar51);
                break;
              case 4:
                auVar15._8_6_ = 0;
                auVar15._0_8_ = local_88[0];
                auVar15[0xe] = uVar75;
                auVar32._8_4_ = 0;
                auVar32._0_8_ = local_88[0];
                auVar32[0xc] = uVar74;
                auVar32._13_2_ = auVar15._13_2_;
                auVar36._8_4_ = 0;
                auVar36._0_8_ = local_88[0];
                auVar36._12_3_ = auVar32._12_3_;
                auVar40._8_2_ = 0;
                auVar40._0_8_ = local_88[0];
                auVar40[10] = uVar73;
                auVar40._11_4_ = auVar36._11_4_;
                auVar44._8_2_ = 0;
                auVar44._0_8_ = local_88[0];
                auVar44._10_5_ = auVar40._10_5_;
                auVar48[8] = uVar72;
                auVar48._0_8_ = local_88[0];
                auVar48._9_6_ = auVar44._9_6_;
                auVar31._1_9_ = SUB169(ZEXT716(auVar48._8_7_) << 0x40,7);
                auVar31[0] = uVar71;
                auVar31._10_6_ = 0;
                auVar30._1_11_ = SUB1611(auVar31 << 0x30,5);
                auVar30[0] = uVar70;
                auVar30._12_4_ = 0;
                auVar68._3_13_ = SUB1613(auVar30 << 0x20,3);
                auVar68[2] = uVar69;
                auVar68[1] = 0;
                auVar68[0] = local_88[0]._0_1_;
                auVar59 = pshuflw(auVar68,auVar68,0x1b);
                sVar1 = auVar59._0_2_;
                sVar2 = auVar59._2_2_;
                sVar3 = auVar59._4_2_;
                sVar4 = auVar59._6_2_;
                fVar57 = (float)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4)
                                         ,CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar59[4] -
                                                   (0xff < sVar3),
                                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) *
                                                            auVar59[2] - (0xff < sVar2),
                                                            (0 < sVar1) * (sVar1 < 0x100) *
                                                            auVar59[0] - (0xff < sVar1))));
                local_88[0] = (double)CONCAT44(local_88[0]._4_4_,fVar57);
                dVar58 = (double)fVar57;
                goto LAB_001698e0;
              case 5:
                auVar13._8_6_ = 0;
                auVar13._0_8_ = local_88[0];
                auVar13[0xe] = uVar75;
                auVar26._8_4_ = 0;
                auVar26._0_8_ = local_88[0];
                auVar26[0xc] = uVar74;
                auVar26._13_2_ = auVar13._13_2_;
                auVar34._8_4_ = 0;
                auVar34._0_8_ = local_88[0];
                auVar34._12_3_ = auVar26._12_3_;
                auVar38._8_2_ = 0;
                auVar38._0_8_ = local_88[0];
                auVar38[10] = uVar73;
                auVar38._11_4_ = auVar34._11_4_;
                auVar42._8_2_ = 0;
                auVar42._0_8_ = local_88[0];
                auVar42._10_5_ = auVar38._10_5_;
                auVar46[8] = uVar72;
                auVar46._0_8_ = local_88[0];
                auVar46._9_6_ = auVar42._9_6_;
                uVar56 = CONCAT17(0,auVar46._8_7_);
                auVar25._8_8_ = 0;
                auVar25._0_8_ = uVar56;
                auVar24._1_9_ = SUB169(auVar25 << 0x40,7);
                auVar24[0] = uVar71;
                auVar24._10_6_ = 0;
                auVar10._1_11_ = SUB1611(auVar24 << 0x30,5);
                auVar10[0] = uVar70;
                auVar23._12_4_ = 0;
                auVar23._0_12_ = auVar10;
                auVar65._3_13_ = SUB1613(auVar23 << 0x20,3);
                auVar65[2] = uVar69;
                auVar65[1] = 0;
                auVar65[0] = local_88[0]._0_1_;
                auVar66._8_4_ = auVar65._0_4_;
                auVar66._0_8_ = uVar56;
                auVar66._12_4_ = auVar10._0_4_;
                auVar59 = pshuflw(auVar66,auVar66,0x1b);
                auVar59 = pshufhw(auVar59,auVar59,0x1b);
                sVar1 = auVar59._0_2_;
                sVar2 = auVar59._2_2_;
                sVar3 = auVar59._4_2_;
                sVar4 = auVar59._6_2_;
                sVar5 = auVar59._8_2_;
                sVar6 = auVar59._10_2_;
                sVar7 = auVar59._12_2_;
                sVar8 = auVar59._14_2_;
                dVar58 = (double)CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar59[0xe] -
                                          (0xff < sVar8),
                                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar59[0xc] -
                                                   (0xff < sVar7),
                                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) *
                                                            auVar59[10] - (0xff < sVar6),
                                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) *
                                                                     auVar59[8] - (0xff < sVar5),
                                                                     CONCAT13((0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar59[6] -
                                                                              (0xff < sVar4),
                                                                              CONCAT12((0 < sVar3) *
                                                                                       (sVar3 < 
                                                  0x100) * auVar59[4] - (0xff < sVar3),
                                                  CONCAT11((0 < sVar2) * (sVar2 < 0x100) *
                                                           auVar59[2] - (0xff < sVar2),
                                                           (0 < sVar1) * (sVar1 < 0x100) *
                                                           auVar59[0] - (0xff < sVar1))))))));
                local_88[0] = dVar58;
                goto LAB_001698e0;
              }
              dVar58 = (double)iVar51;
LAB_001698e0:
              conversion->invalid_value = dVar58;
LAB_001698e6:
              if (nc_type == 2) {
LAB_001698ec:
                base_type = coda_netcdf_basic_type_new(2,*offset,0,(int64_t)local_98);
                bVar11 = 1;
              }
              else {
                bVar11 = 0;
                base_type = coda_netcdf_basic_type_new(nc_type,*offset,0,1);
              }
              if (base_type == (coda_netcdf_basic_type *)0x0) {
LAB_00169a61:
                free(pcVar55);
                pcVar53 = *local_b8;
LAB_00169a9f:
                coda_dynamic_type_delete((coda_dynamic_type *)pcVar53);
                return -1;
              }
              uVar56 = (ulong)(SUB84(local_a0,0) & 3);
              lVar54 = ((*offset + (long)local_a0) - uVar56) + 4;
              if (uVar56 == 0) {
                lVar54 = *offset + (long)local_a0;
              }
              *offset = lVar54;
              if ((bool)(bVar11 | local_98 == 4.94065645841247e-324)) {
                iVar51 = coda_mem_record_add_field
                                   (*local_b8,pcVar55,(coda_dynamic_type *)base_type,1);
                if (iVar51 != 0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)base_type);
                  goto LAB_00169a61;
                }
              }
              else {
                local_88[0] = local_98;
                field_type = (coda_netcdf_basic_type *)
                             coda_netcdf_array_new(1,(long *)local_88,base_type);
                if ((field_type == (coda_netcdf_basic_type *)0x0) ||
                   (iVar51 = coda_mem_record_add_field
                                       (*local_b8,pcVar55,(coda_dynamic_type *)field_type,1),
                   base_type = field_type, iVar51 != 0)) {
                  coda_dynamic_type_delete((coda_dynamic_type *)base_type);
                  goto LAB_00169a61;
                }
              }
              lVar54 = local_a8;
              free(pcVar55);
              lVar54 = lVar54 + 1;
              if (local_48 <= lVar54) {
                return 0;
              }
            } while( true );
          }
        }
      }
      else {
        if (local_bc == 0) {
          *attributes = (coda_mem_record *)0x0;
          if (local_90 == 0) {
            return 0;
          }
          pcVar55 = "invalid netCDF file (invalid value for nelems for empty att_array)";
        }
        else {
          pcVar55 = "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)";
        }
        coda_set_error(-300,pcVar55);
      }
    }
  }
  return -1;
}

Assistant:

static int read_att_array(coda_netcdf_product *product, int64_t *offset, coda_mem_record **attributes,
                          coda_conversion *conversion)
{
    coda_type_record *attributes_definition;
    int32_t tag;
    int64_t num_att;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_att) != 0)
    {
        return -1;
    }
    if (tag == 0)
    {
        *attributes = NULL;
        if (num_att != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty att_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 12)      /* NC_ATTRIBUTE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)");
        return -1;
    }

    attributes_definition = coda_type_record_new(coda_format_netcdf);
    if (attributes_definition == NULL)
    {
        return -1;
    }
    *attributes = coda_mem_record_new(attributes_definition, NULL);
    coda_type_release((coda_type *)attributes_definition);
    if (*attributes == NULL)
    {
        return -1;
    }

    for (i = 0; i < num_att; i++)
    {
        coda_netcdf_basic_type *basic_type;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        long value_length;
        char *name;

        /* nelems */
        if (read_length_value(product, offset, &string_length) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        value_length = (long)nelems;
        switch (nc_type)
        {
            case 1:
            case 2:
                break;
            case 3:
                value_length *= 2;
                break;
            case 4:
            case 5:
                value_length *= 4;
                break;
            case 6:
                value_length *= 8;
                break;
            default:
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
        }

        if (conversion != NULL)
        {
            if (nelems == 1 && (strcmp(name, "scale_factor") == 0 || strcmp(name, "add_offset") == 0))
            {
                if (nc_type == 5)
                {
                    float value;

                    if (read_bytes(product->raw_product, *offset, 4, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_float(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
                else if (nc_type == 6)
                {
                    double value;

                    if (read_bytes(product->raw_product, *offset, 8, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_double(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
            }
            /* note that missing_value has preference over _FillValue */
            /* We therefore don't modify fill_value for _FillValue if fill_value was already set */
            if (nelems == 1 && nc_type != 2 && (strcmp(name, "missing_value") == 0 ||
                                                (strcmp(name, "_FillValue") == 0 &&
                                                 coda_isNaN(conversion->invalid_value))))
            {
                union
                {
                    int8_t as_int8[8];
                    uint8_t as_uint8[8];
                    int16_t as_int16[4];
                    uint16_t as_uint16[4];
                    int32_t as_int32[2];
                    uint32_t as_uint32[2];
                    int64_t as_int64[1];
                    uint64_t as_uint64[1];
                    float as_float[2];
                    double as_double[1];
                } value;

                if (read_bytes(product->raw_product, *offset, value_length, value.as_int8) < 0)
                {
                    free(name);
                    coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                    return -1;
                }
                switch (nc_type)
                {
                    case 1:
                        conversion->invalid_value = (double)value.as_int8[0];
                        break;
                    case 3:
#ifndef WORDS_BIGENDIAN
                        swap_int16(value.as_int16);
#endif
                        conversion->invalid_value = (double)value.as_int16[0];
                        break;
                    case 4:
#ifndef WORDS_BIGENDIAN
                        swap_int32(value.as_int32);
#endif
                        conversion->invalid_value = (double)value.as_int32[0];
                        break;
                    case 5:
#ifndef WORDS_BIGENDIAN
                        swap_float(value.as_float);
#endif
                        conversion->invalid_value = (double)value.as_float[0];
                        break;
                    case 6:
#ifndef WORDS_BIGENDIAN
                        swap_double(value.as_double);
#endif
                        conversion->invalid_value = value.as_double[0];
                        break;
                    case 7:
                        conversion->invalid_value = (double)value.as_uint8[0];
                        break;
                    case 8:
#ifndef WORDS_BIGENDIAN
                        swap_uint16(value.as_uint16);
#endif
                        conversion->invalid_value = (double)value.as_uint16[0];
                        break;
                    case 9:
#ifndef WORDS_BIGENDIAN
                        swap_uint32(value.as_uint32);
#endif
                        conversion->invalid_value = (double)value.as_uint32[0];
                        break;
                    case 10:
#ifndef WORDS_BIGENDIAN
                        swap_int64(value.as_int64);
#endif
                        conversion->invalid_value = (double)value.as_int64[0];
                        break;
                    case 11:
#ifndef WORDS_BIGENDIAN
                        swap_uint64(value.as_uint64);
#endif
                        conversion->invalid_value = (double)value.as_uint64[0];
                        break;
                    default:
                        assert(0);
                        exit(1);
                }
            }
        }

        if (nc_type == 2)       /* treat char arrays as strings */
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, nelems);
        }
        else
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += value_length;
        if ((value_length & 3) != 0)
        {
            *offset += 4 - (value_length & 3);
        }

        if (nc_type == 2 || nelems == 1)
        {
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;
            long dim[CODA_MAX_NUM_DIMS];

            dim[0] = (long)nelems;
            array = coda_netcdf_array_new(1, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}